

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  Rep *pRVar1;
  char *pcVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  Iterator *pIVar5;
  size_type __len2;
  Snapshot *__len2_00;
  long in_FS_OFFSET;
  Slice key;
  WritableFile *file;
  string fname;
  void *local_90;
  Slice local_88;
  char *local_78;
  Snapshot *pSStack_70;
  WritableFile *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&local_58,dbname,meta->number);
  iVar3 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar3 != '\0') {
    (*env->_vptr_Env[4])(&local_78,env,&local_58,&local_60);
    *(char **)this = local_78;
    if ((Rep *)local_78 != (Rep *)0x0) goto LAB_00669b3e;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_60);
    iVar3 = (*iter->_vptr_Iterator[8])(iter);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&(meta->smallest).rep_,0,(meta->smallest).rep_._M_string_length,
               (char *)CONCAT44(extraout_var,iVar3),__len2);
    while (iVar3 = (*iter->_vptr_Iterator[2])(iter), (char)iVar3 != '\0') {
      iVar3 = (*iter->_vptr_Iterator[8])(iter);
      local_78 = (char *)CONCAT44(extraout_var_00,iVar3);
      pSStack_70 = __len2_00;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&(meta->largest).rep_,0,(meta->largest).rep_._M_string_length,local_78,
                 (size_type)__len2_00);
      iVar3 = (*iter->_vptr_Iterator[9])(iter);
      local_88.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      TableBuilder::Add(this_00,(Slice *)&local_78,&local_88);
      (*iter->_vptr_Iterator[6])(iter);
    }
    TableBuilder::Finish((TableBuilder *)&local_78);
    pcVar2 = local_78;
    pRVar1 = *(Rep **)this;
    *(char **)this = local_78;
    local_78 = (char *)pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
    if ((Rep *)pcVar2 == (Rep *)0x0) {
      uVar4 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar4;
      if (uVar4 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
      (*local_60->_vptr_WritableFile[5])(&local_78);
      *(char **)this = local_78;
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
    }
    if (*(long *)this == 0) {
      (*local_60->_vptr_WritableFile[3])(&local_78);
      *(char **)this = local_78;
    }
    if (local_60 != (WritableFile *)0x0) {
      (*local_60->_vptr_WritableFile[1])();
    }
    local_60 = (WritableFile *)0x0;
    if (*(long *)this == 0) {
      local_78 = (char *)0x100;
      pSStack_70 = (Snapshot *)0x0;
      pIVar5 = TableCache::NewIterator
                         (table_cache,(ReadOptions *)&local_78,meta->number,meta->file_size,
                          (Table **)0x0);
      (*pIVar5->_vptr_Iterator[10])(&local_78,pIVar5);
      *(char **)this = local_78;
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
    }
  }
  (*iter->_vptr_Iterator[10])(&local_78,iter);
  if ((Rep *)local_78 != (Rep *)0x0) {
    operator_delete__(local_78);
    (*iter->_vptr_Iterator[10])(&local_78,iter);
    pRVar1 = *(Rep **)this;
    *(char **)this = local_78;
    local_78 = (char *)pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
  }
  if (((*(long *)this != 0) || (meta->file_size == 0)) &&
     ((*env->_vptr_Env[8])(&local_90,env,&local_58), local_90 != (void *)0x0)) {
    operator_delete__(local_90);
  }
LAB_00669b3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}